

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O1

void HTS_Label_check_time(HTS_Label *label)

{
  double dVar1;
  HTS_LabelString *pHVar2;
  HTS_LabelString *pHVar3;
  
  pHVar2 = label->head;
  if (pHVar2 != (HTS_LabelString *)0x0) {
    pHVar2->start = 0.0;
    for (pHVar3 = pHVar2->next; pHVar3 != (HTS_LabelString *)0x0; pHVar3 = pHVar3->next) {
      dVar1 = pHVar2->end;
      if ((0.0 <= dVar1) || (pHVar3->start < 0.0)) {
        if ((0.0 <= dVar1) && (pHVar3->start <= 0.0 && pHVar3->start != 0.0)) {
          pHVar3->start = dVar1;
        }
      }
      else {
        pHVar2->end = pHVar3->start;
      }
      if (pHVar2->start <= 0.0 && pHVar2->start != 0.0) {
        pHVar2->start = -1.0;
      }
      if (pHVar2->end <= 0.0 && pHVar2->end != 0.0) {
        pHVar2->end = -1.0;
      }
      pHVar2 = pHVar3;
    }
  }
  return;
}

Assistant:

static void HTS_Label_check_time(HTS_Label * label)
{
   HTS_LabelString *lstring = label->head;
   HTS_LabelString *next = NULL;

   if (lstring)
      lstring->start = 0.0;
   while (lstring) {
      next = lstring->next;
      if (!next)
         break;
      if (lstring->end < 0.0 && next->start >= 0.0)
         lstring->end = next->start;
      else if (lstring->end >= 0.0 && next->start < 0.0)
         next->start = lstring->end;
      if (lstring->start < 0.0)
         lstring->start = -1.0;
      if (lstring->end < 0.0)
         lstring->end = -1.0;
      lstring = next;
   }
}